

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

void __thiscall
asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
          (basic_streambuf<std::allocator<char>_> *this,size_t maximum_size,
          allocator<char> *allocator)

{
  unsigned_long *puVar1;
  reference pvVar2;
  reference pvVar3;
  vector<char,_std::allocator<char>_> *this_00;
  unsigned_long local_38 [3];
  size_t pend;
  allocator<char> *allocator_local;
  size_t maximum_size_local;
  basic_streambuf<std::allocator<char>_> *this_local;
  
  pend = (size_t)allocator;
  allocator_local = (allocator<char> *)maximum_size;
  maximum_size_local = (size_t)this;
  std::streambuf::streambuf(this);
  detail::noncopyable::noncopyable((noncopyable *)this);
  *(undefined ***)this = &PTR__basic_streambuf_001b9890;
  this->max_size_ = (size_t)allocator_local;
  fineftp::std::vector<char,_std::allocator<char>_>::vector(&this->buffer_,(allocator_type *)pend);
  local_38[1] = 0x80;
  puVar1 = std::min<unsigned_long>(&this->max_size_,local_38 + 1);
  local_38[2] = *puVar1;
  local_38[0] = 1;
  puVar1 = std::max<unsigned_long>(local_38 + 2,local_38);
  fineftp::std::vector<char,_std::allocator<char>_>::resize(&this->buffer_,*puVar1);
  this_00 = &this->buffer_;
  pvVar2 = fineftp::std::vector<char,_std::allocator<char>_>::operator[](this_00,0);
  pvVar3 = fineftp::std::vector<char,_std::allocator<char>_>::operator[](this_00,0);
  fineftp::std::vector<char,_std::allocator<char>_>::operator[](this_00,0);
  std::streambuf::setg((char *)this,pvVar2,pvVar3);
  pvVar2 = fineftp::std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
  fineftp::std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,0);
  std::streambuf::setp((char *)this,pvVar2);
  return;
}

Assistant:

explicit basic_streambuf(
      std::size_t maximum_size = (std::numeric_limits<std::size_t>::max)(),
      const Allocator& allocator = Allocator())
    : max_size_(maximum_size),
      buffer_(allocator)
  {
    std::size_t pend = (std::min<std::size_t>)(max_size_, buffer_delta);
    buffer_.resize((std::max<std::size_t>)(pend, 1));
    setg(&buffer_[0], &buffer_[0], &buffer_[0]);
    setp(&buffer_[0], &buffer_[0] + pend);
  }